

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QSize __thiscall QToolBarAreaLayoutInfo::minimumSize(QToolBarAreaLayoutInfo *this)

{
  Orientation OVar1;
  bool bVar2;
  QSize QVar3;
  uint uVar4;
  Representation RVar5;
  long lVar6;
  ulong uVar7;
  QToolBarAreaLayoutLine *this_00;
  uint uVar8;
  
  if ((this->lines).d.size == 0) {
    uVar8 = 0;
    uVar4 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    uVar4 = 0;
    uVar8 = 0;
    do {
      this_00 = (QToolBarAreaLayoutLine *)((long)&(((this->lines).d.ptr)->rect).x1.m_i + lVar6);
      bVar2 = QToolBarAreaLayoutLine::skip(this_00);
      if (!bVar2) {
        QVar3 = QToolBarAreaLayoutLine::minimumSize(this_00);
        RVar5.m_i = QVar3.ht.m_i.m_i;
        if (this->o == Horizontal) {
          RVar5.m_i = QVar3.wd.m_i.m_i;
        }
        if ((int)uVar8 <= RVar5.m_i) {
          uVar8 = RVar5.m_i;
        }
        RVar5.m_i = QVar3.ht.m_i.m_i;
        if (this->o == Vertical) {
          RVar5.m_i = QVar3.wd.m_i.m_i;
        }
        uVar4 = RVar5.m_i + uVar4;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x30;
    } while (uVar7 < (ulong)(this->lines).d.size);
  }
  OVar1 = this->o;
  uVar7 = 0xffffffff;
  if (OVar1 == Horizontal) {
    uVar7 = (ulong)uVar8;
  }
  if (OVar1 != Vertical) {
    uVar8 = uVar4;
  }
  if (OVar1 == Vertical) {
    uVar7 = (ulong)uVar4;
  }
  return (QSize)(uVar7 | (ulong)uVar8 << 0x20);
}

Assistant:

QSize QToolBarAreaLayoutInfo::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < lines.size(); ++i) {
        const QToolBarAreaLayoutLine &l = lines.at(i);
        if (l.skip())
            continue;

        QSize m = l.minimumSize();
        a = qMax(a, pick(o, m));
        b += perp(o, m);
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}